

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogListView::keyPressEvent(QFileDialogListView *this,QKeyEvent *e)

{
  bool bVar1;
  
  bVar1 = QFileDialogPrivate::itemViewKeyboardEvent(this->d_ptr,e);
  if (!bVar1) {
    QAbstractItemView::keyPressEvent((QAbstractItemView *)this,e);
  }
  e[0xc] = (QKeyEvent)0x1;
  return;
}

Assistant:

void QFileDialogListView::keyPressEvent(QKeyEvent *e)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
        QListView::keyPressEvent(e);
        return;
    }
#endif // QT_KEYPAD_NAVIGATION

    if (!d_ptr->itemViewKeyboardEvent(e))
        QListView::keyPressEvent(e);
    e->accept();
}